

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbTest.c
# Opt level: O1

void Acb_NtkPrintCecStats(Acb_Ntk_t *pNtk)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  
  iVar2 = (pNtk->vObjType).nSize;
  uVar6 = 0;
  uVar5 = 0;
  if (1 < (long)iVar2) {
    iVar3 = (pNtk->vObjType).nSize;
    iVar4 = 1;
    if (1 < iVar3) {
      iVar4 = iVar3;
    }
    uVar5 = 0;
    lVar7 = 1;
    uVar6 = 0;
    do {
      if (iVar4 - 1U <= iVar2 - 2U) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      bVar1 = (pNtk->vObjType).pArray[lVar7];
      if ((4 < bVar1) || ((0x19U >> (bVar1 & 0x1f) & 1) == 0)) {
        if (bVar1 == 0x4e) {
          uVar6 = uVar6 + 1;
        }
        else {
          uVar5 = uVar5 + (bVar1 == 0x15);
        }
      }
      lVar7 = lVar7 + 1;
    } while (iVar2 != lVar7);
  }
  printf("PI = %6d  ",(ulong)(uint)(pNtk->vCis).nSize);
  printf("PO = %6d  ",(ulong)(uint)(pNtk->vCos).nSize);
  printf("Obj = %6d  ",(ulong)((pNtk->vObjType).nSize - 1));
  printf("DC = %4d  ",(ulong)uVar6);
  printf("Mux = %4d  ",(ulong)uVar5);
  putchar(10);
  return;
}

Assistant:

void Acb_NtkPrintCecStats( Acb_Ntk_t * pNtk )
{
    int iObj, nDcs = 0, nMuxes = 0;
    Acb_NtkForEachNode( pNtk, iObj )
        if ( Acb_ObjType( pNtk, iObj ) == ABC_OPER_TRI )
            nDcs++;
        else if ( Acb_ObjType( pNtk, iObj ) == ABC_OPER_BIT_MUX )
            nMuxes++;

    printf( "PI = %6d  ",  Acb_NtkCiNum(pNtk) );
    printf( "PO = %6d  ",  Acb_NtkCoNum(pNtk) );
    printf( "Obj = %6d  ", Acb_NtkObjNum(pNtk) );
    printf( "DC = %4d  ",  nDcs );
    printf( "Mux = %4d  ", nMuxes );
    printf( "\n" );
}